

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::declare_undefined_values(CompilerMSL *this)

{
  size_t sVar1;
  Variant *pVVar2;
  SPIRUndef *pSVar3;
  SPIRType *pSVar4;
  TypedID<(spirv_cross::Types)0> *pTVar5;
  TypedID<(spirv_cross::Types)0> *pTVar6;
  bool bVar7;
  LoopLock LStack_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[0xc].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar1 == 0) {
    ParsedIR::LoopLock::~LoopLock(&LStack_78);
  }
  else {
    pTVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[0xc].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar6 = pTVar5 + sVar1;
    bVar7 = false;
    do {
      while( true ) {
        pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr;
        if (pVVar2[pTVar5->id].type == TypeUndef) break;
LAB_0025f29a:
        pTVar5 = pTVar5 + 1;
        if (pTVar5 == pTVar6) {
          ParsedIR::LoopLock::~LoopLock(&LStack_78);
          if (!bVar7) {
            return;
          }
          goto LAB_0025f348;
        }
      }
      pSVar3 = Variant::get<spirv_cross::SPIRUndef>(pVVar2 + pTVar5->id);
      pSVar4 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)&(pSVar3->super_IVariant).field_0xc);
      if (*(int *)&(pSVar4->super_IVariant).field_0xc == 1) goto LAB_0025f29a;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (local_70,this,(ulong)(pSVar3->super_IVariant).self.id,1);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
                (&local_50,this,pSVar4,local_70,(ulong)(pSVar3->super_IVariant).self.id);
      CompilerGLSL::statement<char_const(&)[10],std::__cxx11::string,char_const(&)[7]>
                (&this->super_CompilerGLSL,(char (*) [10])"constant ",&local_50,
                 (char (*) [7])" = {};");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      pTVar5 = pTVar5 + 1;
      bVar7 = true;
    } while (pTVar5 != pTVar6);
    ParsedIR::LoopLock::~LoopLock(&LStack_78);
LAB_0025f348:
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2d80a2);
  }
  return;
}

Assistant:

void CompilerMSL::declare_undefined_values()
{
	bool emitted = false;
	ir.for_each_typed_id<SPIRUndef>([&](uint32_t, SPIRUndef &undef) {
		auto &type = this->get<SPIRType>(undef.basetype);
		// OpUndef can be void for some reason ...
		if (type.basetype == SPIRType::Void)
			return;

		statement("constant ", variable_decl(type, to_name(undef.self), undef.self), " = {};");
		emitted = true;
	});

	if (emitted)
		statement("");
}